

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_vcodec_client.c
# Opt level: O1

RK_S32 mpp_vcodec_open(void)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  
  iVar1 = open64("/dev/vcodec",0x80002);
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    _mpp_log_l(2,"mpp_vcodec","open /dev/vcodec failed errno %d %s\n",(char *)0x0,(ulong)__errnum,
               pcVar3);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

RK_S32 mpp_vcodec_open(void)
{
    RK_S32 fd = -1;

    fd = open("/dev/vcodec", O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open /dev/vcodec failed errno %d %s\n", errno, strerror(errno));
        return -1;
    }

    return fd;
}